

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  bool bVar1;
  TargetType TVar2;
  string *config_00;
  ulong uVar3;
  char *in_name;
  bool local_182;
  bool local_181;
  bool local_151;
  undefined1 local_150 [8];
  string lib;
  ArtifactType artifact_1;
  bool implib;
  string *local_108;
  string *libName;
  Item local_e0;
  Item local_b0;
  undefined1 local_80 [8];
  string exe;
  ArtifactType artifact;
  undefined1 local_50 [8];
  string linkItem;
  bool impexe;
  string *config;
  cmGeneratorTarget *tgt_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  config_00 = &this->Config;
  local_151 = false;
  if (tgt != (cmGeneratorTarget *)0x0) {
    local_151 = cmGeneratorTarget::IsExecutableWithExports(tgt);
  }
  linkItem.field_2._M_local_buf[0xf] = local_151;
  if (((local_151 == false) || ((this->UseImportLibrary & 1U) != 0)) ||
     (this->LoaderFlag != (char *)0x0)) {
    if ((tgt == (cmGeneratorTarget *)0x0) || (bVar1 = cmGeneratorTarget::IsLinkable(tgt), !bVar1)) {
      in_name = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsDirectory(item);
        if (bVar1) {
          AddDirectoryItem(this,item);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Depends,item);
          AddFullItem(this,item);
          AddLibraryRuntimeInfo(this,item);
        }
      }
      else {
        AddUserItem(this,item,true);
      }
    }
    else if (((linkItem.field_2._M_local_buf[0xf] & 1U) == 0) || (this->LoaderFlag == (char *)0x0))
    {
      TVar2 = cmGeneratorTarget::GetType(tgt);
      if (TVar2 == INTERFACE_LIBRARY) {
        std::__cxx11::string::string((string *)&libName);
        Item::Item(&local_e0,(string *)&libName,false,tgt);
        std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
        ::push_back(&this->Items,&local_e0);
        Item::~Item(&local_e0);
        std::__cxx11::string::~string((string *)&libName);
        cmGeneratorTarget::GetImportedLibName((string *)&artifact_1,tgt,config_00);
        local_108 = (string *)&artifact_1;
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          AddItem(this,local_108,(cmGeneratorTarget *)0x0);
        }
        std::__cxx11::string::~string((string *)&artifact_1);
      }
      else {
        local_181 = false;
        if ((this->UseImportLibrary & 1U) != 0) {
          local_182 = true;
          if ((linkItem.field_2._M_local_buf[0xf] & 1U) == 0) {
            TVar2 = cmGeneratorTarget::GetType(tgt);
            local_182 = TVar2 == SHARED_LIBRARY;
          }
          local_181 = local_182;
        }
        lib.field_2._M_local_buf[0xf] = local_181;
        lib.field_2._8_4_ = ZEXT14(local_181 != false);
        cmGeneratorTarget::GetFullPath((string *)local_150,tgt,config_00,lib.field_2._8_4_,true);
        if (((this->LinkDependsNoShared & 1U) == 0) ||
           (TVar2 = cmGeneratorTarget::GetType(tgt), TVar2 != SHARED_LIBRARY)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Depends,(value_type *)local_150);
        }
        AddTargetItem(this,(string *)local_150,tgt);
        AddLibraryRuntimeInfo(this,(string *)local_150,tgt);
        std::__cxx11::string::~string((string *)local_150);
      }
    }
    else {
      std::__cxx11::string::string((string *)local_50);
      std::__cxx11::string::operator=((string *)local_50,this->LoaderFlag);
      exe.field_2._8_4_ = this->UseImportLibrary & ImportLibraryArtifact;
      cmGeneratorTarget::GetFullPath((string *)local_80,tgt,config_00,exe.field_2._8_4_,true);
      std::__cxx11::string::operator+=((string *)local_50,(string *)local_80);
      Item::Item(&local_b0,(string *)local_50,true,tgt);
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      push_back(&this->Items,&local_b0);
      Item::~Item(&local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Depends,(value_type *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(std::string const& item,
                                       cmGeneratorTarget const* tgt)
{
  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !this->UseImportLibrary && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now.
      std::string linkItem;
      linkItem = this->LoaderFlag;
      cmStateEnums::ArtifactType artifact = this->UseImportLibrary
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      std::string exe = tgt->GetFullPath(config, artifact, true);
      linkItem += exe;
      this->Items.push_back(Item(linkItem, true, tgt));
      this->Depends.push_back(exe);
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.push_back(Item(std::string(), false, tgt));

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(libName, CM_NULLPTR);
      }
    } else {
      // Decide whether to use an import library.
      bool implib =
        (this->UseImportLibrary &&
         (impexe || tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      std::string lib = tgt->GetFullPath(config, artifact, true);
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib);
      }

      this->AddTargetItem(lib, tgt);
      this->AddLibraryRuntimeInfo(lib, tgt);
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmSystemTools::FileIsFullPath(item.c_str())) {
      if (cmSystemTools::FileIsDirectory(item)) {
        // This is a directory.
        this->AddDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item);
        this->AddFullItem(item);
        this->AddLibraryRuntimeInfo(item);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(item, true);
    }
  }
}